

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_set_format_pax(archive *_a)

{
  long lVar1;
  int iVar2;
  void *__s;
  archive *in_RDI;
  int magic_test;
  pax *pax;
  archive_write *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  int local_4;
  
  iVar2 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar2 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    lVar1._0_4_ = in_RDI[2].file_count;
    lVar1._4_4_ = in_RDI[2].archive_error_number;
    if (lVar1 != 0) {
      (**(code **)&in_RDI[2].file_count)(in_RDI);
    }
    __s = malloc(0x80);
    if (__s == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate pax data");
      local_4 = -0x1e;
    }
    else {
      memset(__s,0,0x80);
      *(void **)&in_RDI[1].current_codepage = __s;
      in_RDI[1].sconv = (archive_string_conv *)0x2c600e;
      in_RDI[2].vtable = (archive_vtable_conflict *)archive_write_pax_options;
      in_RDI[2].archive_format_name = (char *)archive_write_pax_header;
      *(code **)&in_RDI[2].compression_code = archive_write_pax_data;
      in_RDI[2].compression_name = (char *)archive_write_pax_close;
      *(code **)&in_RDI[2].file_count = archive_write_pax_free;
      *(code **)&in_RDI[2].archive_format = archive_write_pax_finish_entry;
      in_RDI->archive_format = 0x30002;
      in_RDI->archive_format_name = "POSIX pax interchange";
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
archive_write_set_format_pax(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct pax *pax;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_pax");

	if (a->format_free != NULL)
		(a->format_free)(a);

	pax = (struct pax *)malloc(sizeof(*pax));
	if (pax == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate pax data");
		return (ARCHIVE_FATAL);
	}
	memset(pax, 0, sizeof(*pax));
	a->format_data = pax;
	a->format_name = "pax";
	a->format_options = archive_write_pax_options;
	a->format_write_header = archive_write_pax_header;
	a->format_write_data = archive_write_pax_data;
	a->format_close = archive_write_pax_close;
	a->format_free = archive_write_pax_free;
	a->format_finish_entry = archive_write_pax_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
	a->archive.archive_format_name = "POSIX pax interchange";
	return (ARCHIVE_OK);
}